

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_fast_usingDict
              (char *source,char *dest,int originalSize,char *dictStart,int dictSize)

{
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  long lVar5;
  ushort *puVar6;
  ulong uVar7;
  ulong uVar8;
  size_t l_1;
  ulong uVar9;
  size_t dictSize_00;
  uint uVar10;
  size_t l;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  BYTE *op;
  ushort *__src;
  char cVar14;
  int local_40;
  
  dictSize_00 = (size_t)dictSize;
  if ((dictSize != 0) && (dictStart + dictSize_00 != dest)) {
    iVar4 = LZ4_decompress_fast_extDict(source,dest,originalSize,dictStart,dictSize_00);
    return iVar4;
  }
  pcVar13 = dest + originalSize;
  lVar5 = (long)dest - dictSize_00;
  puVar6 = (ushort *)source;
  do {
    uVar2 = *puVar6;
    __src = (ushort *)((long)puVar6 + 1);
    uVar10 = (uint)(byte)((byte)uVar2 >> 4);
    uVar12 = (ulong)uVar10;
    if (uVar10 == 0xf) {
      lVar11 = 0;
      do {
        uVar3 = *__src;
        __src = (ushort *)((long)__src + 1);
        lVar11 = lVar11 + (ulong)(byte)uVar3;
      } while ((ulong)(byte)uVar3 == 0xff);
      uVar12 = lVar11 + 0xf;
    }
    cVar14 = '\0';
    if ((ulong)((long)pcVar13 - (long)dest) < uVar12) {
      cVar14 = '\x01';
LAB_003498f6:
      bVar1 = false;
    }
    else {
      memmove(dest,__src,uVar12);
      dest = dest + uVar12;
      __src = (ushort *)((long)__src + uVar12);
      bVar1 = true;
      if ((ulong)((long)pcVar13 - (long)dest) < 0xc) {
        cVar14 = (dest == pcVar13) * '\x02' + '\x01';
        goto LAB_003498f6;
      }
    }
    puVar6 = __src;
    if (bVar1) {
      uVar12 = (ulong)((byte)uVar2 & 0xf);
      puVar6 = __src + 1;
      if (uVar12 == 0xf) {
        lVar11 = 0;
        do {
          uVar2 = *puVar6;
          puVar6 = (ushort *)((long)puVar6 + 1);
          lVar11 = lVar11 + (ulong)(byte)uVar2;
        } while ((ulong)(byte)uVar2 == 0xff);
        uVar12 = lVar11 + 0xf;
      }
      uVar12 = uVar12 + 4;
      cVar14 = '\x01';
      if (uVar12 <= (ulong)((long)pcVar13 - (long)dest)) {
        uVar7 = (ulong)*__src;
        uVar8 = (long)dest - lVar5;
        if (uVar7 <= uVar8) {
          if (uVar12 != 0) {
            uVar9 = 0;
            do {
              dest[uVar9] = dest[uVar9 - uVar7];
              uVar9 = uVar9 + 1;
            } while (uVar12 != uVar9);
          }
          if (uVar7 <= uVar8) {
            dest = dest + uVar12;
            cVar14 = (ulong)((long)pcVar13 - (long)dest) < 5;
          }
        }
      }
    }
    if (cVar14 != '\0') {
      if (cVar14 == '\x03') {
        local_40 = (int)source;
        local_40 = (int)puVar6 - local_40;
      }
      else {
        local_40 = -1;
      }
      return local_40;
    }
  } while( true );
}

Assistant:

int LZ4_decompress_fast_usingDict(const char* source, char* dest, int originalSize, const char* dictStart, int dictSize)
{
    if (dictSize==0 || dictStart+dictSize == dest)
        return LZ4_decompress_unsafe_generic(
                        (const BYTE*)source, (BYTE*)dest, originalSize,
                        (size_t)dictSize, NULL, 0);
    assert(dictSize >= 0);
    return LZ4_decompress_fast_extDict(source, dest, originalSize, dictStart, (size_t)dictSize);
}